

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  Source *pSVar4;
  Lexem *pLVar5;
  ulong uVar6;
  size_type sVar7;
  char **ppcVar8;
  ostream *poVar9;
  bool *args_2;
  size_t sVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf_02;
  int local_1264;
  char *local_1240;
  char *local_1220;
  char *local_11e8;
  char *local_11c0;
  char *local_1198;
  char *local_1160;
  char *local_1138;
  char *local_10f8;
  char *local_10c8;
  char *local_1078;
  char *local_1018;
  char *local_1010;
  char *local_1008;
  char *local_1000;
  char *local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fe0;
  char *local_fd8;
  char *local_fd0;
  char *msg;
  StreamSep local_f78;
  StreamSep local_f30;
  StreamSep local_ee8;
  StreamSep local_ea0;
  StreamSep local_e58;
  StreamSep local_e10;
  StreamSep local_dc8;
  StreamSep local_d80;
  StreamSep local_d38;
  StreamSep local_cf0;
  TS local_ca8 [8];
  ofstream fout;
  string local_aa8;
  allocator local_a81;
  string local_a80;
  string local_a60;
  string local_a40;
  undefined1 local_a20 [8];
  StreamSepMaker ss;
  vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> local_980;
  undefined1 local_968 [8];
  CppEmitter ce;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_870;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_840;
  undefined1 local_810 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  disp;
  string local_7f0 [32];
  istringstream local_7d0 [8];
  istringstream iss;
  undefined1 local_650 [8];
  InstructionGraph ig;
  string local_488;
  undefined1 local_468 [8];
  CharGraph cg;
  int tmp_3;
  int _preparg_num_ch_1;
  bool has_flag_1;
  char *pcStack_2d0;
  int tmp_2;
  char *_preparg_arg_1;
  char *pcStack_2c0;
  int _preparg_num_arg_1;
  reference local_2b8;
  string *str;
  iterator __end1;
  iterator __begin1;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__range1;
  undefined1 local_290 [8];
  Vec<const_char_*> lfc;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> lfs;
  uint local_258;
  bool local_251;
  int i;
  Lexer lexer;
  Pool<Hpipe::Source,_32> source_pool;
  undefined1 local_100 [8];
  ErrorList error_list;
  int tmp_1;
  int _preparg_num_ch;
  bool has_flag;
  char *pcStack_60;
  int tmp;
  char *_preparg_arg;
  int _preparg_num_arg;
  int beg_files;
  char *args;
  char *pcStack_40;
  int stop_char;
  char *style;
  char *output;
  bool never_ending;
  bool no_training;
  bool trace_labels;
  bool boyer_moore;
  bool benchmark;
  bool test;
  bool disp_trans_freq;
  bool disp_inst_pred;
  char *disp_inst_graph;
  bool disp_char_graph;
  char **ppcStack_18;
  bool disp_lexem_graph;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  disp_inst_graph._7_1_ = 0;
  disp_inst_graph._6_1_ = 0;
  _never_ending = "";
  output._7_1_ = 0;
  output._6_1_ = 0;
  output._5_1_ = 0;
  output._4_1_ = 0;
  output._3_1_ = 0;
  output._2_1_ = 0;
  output._1_1_ = 0;
  output._0_1_ = 0;
  style = (char *)0x0;
  pcStack_40 = "HPIPE_BUFFER";
  args._4_4_ = 0;
  __preparg_num_arg = (char *)0x0;
  _preparg_arg._4_4_ = 0xffffffff;
  _preparg_arg._0_4_ = 1;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
LAB_001a180c:
  if ((int)(uint)_preparg_arg < (int)argv_local) {
    pcStack_60 = ppcStack_18[(int)(uint)_preparg_arg];
    if (*pcStack_60 != '-') goto LAB_001a264a;
    if (pcStack_60[1] != '-') {
LAB_001a1f6e:
      bVar2 = false;
      error_list._140_4_ = 1;
      do {
        if (pcStack_60[(int)error_list._140_4_] == 'l') {
          disp_inst_graph._7_1_ = 1;
        }
        else if (pcStack_60[(int)error_list._140_4_] == 'c') {
          disp_inst_graph._6_1_ = 1;
        }
        else if (pcStack_60[(int)error_list._140_4_] == 'p') {
          output._7_1_ = 1;
        }
        else if (pcStack_60[(int)error_list._140_4_] == 'f') {
          output._6_1_ = 1;
        }
        else if (pcStack_60[(int)error_list._140_4_] == 't') {
          output._5_1_ = 1;
        }
        else {
          if (pcStack_60[(int)error_list._140_4_] != 'b') goto LAB_001a202e;
          output._4_1_ = 1;
        }
        bVar2 = true;
        error_list._140_4_ = error_list._140_4_ + 1;
      } while( true );
    }
    iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"disp_lexem_graph");
    if (iVar3 == 0) {
      iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"disp_char_graph");
      if (iVar3 == 0) {
        iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"disp_inst_graph");
        if (iVar3 == 0) {
          iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"disp_inst_pred");
          if (iVar3 == 0) {
            iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"disp_trans_freq");
            if (iVar3 == 0) {
              iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"test");
              if (iVar3 == 0) {
                iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"benchmark");
                if (iVar3 == 0) {
                  iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"boyer_moore");
                  if (iVar3 == 0) {
                    iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"trace_labels");
                    if (iVar3 == 0) {
                      iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"no_training");
                      if (iVar3 == 0) {
                        iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"never_ending");
                        if (iVar3 == 0) {
                          iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"output");
                          if (iVar3 == 0) {
                            iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"style");
                            if (iVar3 == 0) {
                              iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"stop_char");
                              if (iVar3 == 0) {
                                iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"args");
                                if (iVar3 == 0) {
                                  iVar3 = _preparg_streq_u2m(pcStack_60 + 2,"help");
                                  if (iVar3 != 0) {
                                    usage(*ppcStack_18,(char *)0x0,0);
                                    return 0;
                                  }
                                  goto LAB_001a1f6e;
                                }
                                if ((int)argv_local <= (int)((uint)_preparg_arg + 1)) {
                                  printf("%s","Error: ");
                                  printf("%c",0x61);
                                  printf("%s"," or --");
                                  _preparg_dispu("args");
                                  printf("%s"," must be followed by an argument.\n\n");
                                  printf("%s","Try \'");
                                  if (*ppcStack_18 == (char *)0x0) {
                                    local_ff0 = "";
                                  }
                                  else {
                                    local_ff0 = *ppcStack_18;
                                  }
                                  printf("%s",local_ff0);
                                  printf("%s"," --help\' for more information.\n");
                                  return 0x11;
                                }
                                _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
                                __preparg_num_arg = ppcStack_18[(int)(uint)_preparg_arg];
                              }
                              else {
                                if ((int)argv_local <= (int)((uint)_preparg_arg + 1)) {
LAB_001a1d3e:
                                  printf("%s","Error: ");
                                  printf("%c",0);
                                  printf("%s"," or --");
                                  _preparg_dispu("stop_char");
                                  printf("%s"," must be followed by an integer.\n\n");
                                  printf("%s","Try \'");
                                  if (*ppcStack_18 == (char *)0x0) {
                                    local_fe8 = "";
                                  }
                                  else {
                                    local_fe8 = *ppcStack_18;
                                  }
                                  printf("%s",local_fe8);
                                  printf("%s"," --help\' for more information.\n");
                                  return 0x10;
                                }
                                _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
                                bVar2 = _preparg_atoi(&_preparg_num_ch,
                                                      ppcStack_18[(int)(uint)_preparg_arg]);
                                if (!bVar2) goto LAB_001a1d3e;
                                args._4_4_ = _preparg_num_ch;
                              }
                            }
                            else {
                              if ((int)argv_local <= (int)((uint)_preparg_arg + 1)) {
                                printf("%s","Error: ");
                                printf("%c",0x73);
                                printf("%s"," or --");
                                _preparg_dispu("style");
                                printf("%s"," must be followed by an argument.\n\n");
                                printf("%s","Try \'");
                                if (*ppcStack_18 == (char *)0x0) {
                                  local_fe0 = "";
                                }
                                else {
                                  local_fe0 = *ppcStack_18;
                                }
                                printf("%s",local_fe0);
                                printf("%s"," --help\' for more information.\n");
                                return 0xf;
                              }
                              _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
                              pcStack_40 = ppcStack_18[(int)(uint)_preparg_arg];
                            }
                          }
                          else {
                            if ((int)argv_local <= (int)((uint)_preparg_arg + 1)) {
                              printf("%s","Error: ");
                              printf("%c",0x6f);
                              printf("%s"," or --");
                              _preparg_dispu("output");
                              printf("%s"," must be followed by an argument.\n\n");
                              printf("%s","Try \'");
                              if (*ppcStack_18 == (char *)0x0) {
                                local_fd8 = "";
                              }
                              else {
                                local_fd8 = *ppcStack_18;
                              }
                              printf("%s",local_fd8);
                              printf("%s"," --help\' for more information.\n");
                              return 0xe;
                            }
                            _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
                            style = ppcStack_18[(int)(uint)_preparg_arg];
                          }
                        }
                        else {
                          output._0_1_ = 1;
                        }
                      }
                      else {
                        output._1_1_ = 1;
                      }
                    }
                    else {
                      output._2_1_ = 1;
                    }
                  }
                  else {
                    output._3_1_ = 1;
                  }
                }
                else {
                  output._4_1_ = 1;
                }
              }
              else {
                output._5_1_ = 1;
              }
            }
            else {
              output._6_1_ = 1;
            }
          }
          else {
            output._7_1_ = 1;
          }
        }
        else {
          if ((int)argv_local <= (int)((uint)_preparg_arg + 1)) {
            printf("%s","Error: ");
            printf("%c",0x69);
            printf("%s"," or --");
            _preparg_dispu("disp_inst_graph");
            printf("%s"," must be followed by an argument.\n\n");
            printf("%s","Try \'");
            if (*ppcStack_18 == (char *)0x0) {
              local_fd0 = "";
            }
            else {
              local_fd0 = *ppcStack_18;
            }
            printf("%s",local_fd0);
            printf("%s"," --help\' for more information.\n");
            return 5;
          }
          _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
          _never_ending = ppcStack_18[(int)(uint)_preparg_arg];
        }
      }
      else {
        disp_inst_graph._6_1_ = 1;
      }
    }
    else {
      disp_inst_graph._7_1_ = 1;
    }
    goto LAB_001a2652;
  }
LAB_001a2660:
  if ((int)_preparg_arg._4_4_ < 0) {
    iVar3 = usage(*ppcStack_18,"Please specify one or several input file",2);
    return iVar3;
  }
  Hpipe::ErrorList::ErrorList((ErrorList *)local_100);
  Hpipe::Pool<Hpipe::Source,_32>::Pool((Pool<Hpipe::Source,_32> *)&lexer.num_grp_bracket);
  Hpipe::Lexer::Lexer((Lexer *)&i,(ErrorList *)local_100,
                      (Pool<Hpipe::Source,_32> *)&lexer.num_grp_bracket);
  if ((disp_inst_graph._7_1_ & 1) == 0) {
    local_251 = false;
    args_2 = &local_251;
    pSVar4 = Hpipe::Pool<Hpipe::Source,32>::New<char_const(&)[22],char(&)[6897],bool>
                       ((Pool<Hpipe::Source,32> *)&lexer.num_grp_bracket,
                        (char (*) [22])"src/Hpipe/predef.sipe",&predef,args_2);
    Hpipe::Lexer::read((Lexer *)&i,(int)pSVar4,__buf,(size_t)args_2);
  }
  for (local_258 = _preparg_arg._4_4_; (int)local_258 < (int)argv_local; local_258 = local_258 + 1)
  {
    sVar10 = (size_t)(int)local_258;
    pSVar4 = Hpipe::Pool<Hpipe::Source,32>::New<char*&>
                       ((Pool<Hpipe::Source,32> *)&lexer.num_grp_bracket,ppcStack_18 + sVar10);
    Hpipe::Lexer::read((Lexer *)&i,(int)pSVar4,__buf_00,sVar10);
  }
  if ((disp_inst_graph._7_1_ & 1) == 0) {
    bVar2 = Hpipe::ErrorList::operator_cast_to_bool((ErrorList *)local_100);
    if (bVar2) {
      Hpipe::Lexer::flags_abi_cxx11_
                ((Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(Lexer *)&i);
      Hpipe::Vec<const_char_*>::Vec((Vec<const_char_*> *)local_290);
      __range1 = (Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)anon_var_dwarf_462b;
      Hpipe::Vec<const_char_*>::operator<<((Vec<const_char_*> *)local_290,(char **)&__range1);
      this = &lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this);
      str = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&str), bVar2) {
        local_2b8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end1);
        pcStack_2c0 = (char *)std::__cxx11::string::c_str();
        Hpipe::Vec<const_char_*>::operator<<
                  ((Vec<const_char_*> *)local_290,&stack0xfffffffffffffd40);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      _preparg_arg_1._4_4_ = 1;
LAB_001a2962:
      uVar6 = (ulong)(int)_preparg_arg_1._4_4_;
      sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_290);
      if (sVar7 <= uVar6) goto LAB_001a3f7a;
      ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                          ((Vec<const_char_*> *)local_290,_preparg_arg_1._4_4_);
      pcStack_2d0 = *ppcVar8;
      if (*pcStack_2d0 != '-') goto LAB_001a3f5b;
      if (pcStack_2d0[1] != '-') {
LAB_001a34ff:
        bVar2 = false;
        cg.calls.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        do {
          if (pcStack_2d0
              [cg.calls.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 'l') {
            disp_inst_graph._7_1_ = 1;
          }
          else if (pcStack_2d0
                   [cg.calls.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 'c') {
            disp_inst_graph._6_1_ = 1;
          }
          else if (pcStack_2d0
                   [cg.calls.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 'p') {
            output._7_1_ = 1;
          }
          else if (pcStack_2d0
                   [cg.calls.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 'f') {
            output._6_1_ = 1;
          }
          else if (pcStack_2d0
                   [cg.calls.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] == 't') {
            output._5_1_ = 1;
          }
          else {
            sVar7 = (size_type)
                    cg.calls.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            if (pcStack_2d0[sVar7] != 'b') goto LAB_001a3604;
            output._4_1_ = 1;
          }
          bVar2 = true;
          cg.calls.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               cg.calls.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        } while( true );
      }
      iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"disp_lexem_graph");
      if (iVar3 == 0) {
        iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"disp_char_graph");
        if (iVar3 == 0) {
          iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"disp_inst_graph");
          if (iVar3 == 0) {
            iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"disp_inst_pred");
            if (iVar3 == 0) {
              iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"disp_trans_freq");
              if (iVar3 != 0) {
                output._6_1_ = 1;
                goto LAB_001a3f66;
              }
              iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"test");
              if (iVar3 == 0) {
                iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"benchmark");
                if (iVar3 == 0) {
                  iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"boyer_moore");
                  if (iVar3 == 0) {
                    iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"trace_labels");
                    if (iVar3 == 0) {
                      iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"no_training");
                      if (iVar3 == 0) {
                        iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"never_ending");
                        if (iVar3 == 0) {
                          iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"output");
                          if (iVar3 == 0) {
                            iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"style");
                            if (iVar3 == 0) {
                              iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"stop_char");
                              if (iVar3 != 0) {
                                iVar3 = _preparg_arg_1._4_4_ + 1;
                                sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::
                                        size((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                             local_290);
                                if ((ulong)(long)iVar3 < sVar7) {
                                  _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
                                  ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                      ((Vec<const_char_*> *)local_290,
                                                       _preparg_arg_1._4_4_);
                                  bVar2 = _preparg_atoi(&_preparg_num_ch_1,*ppcVar8);
                                  if (bVar2) {
                                    args._4_4_ = _preparg_num_ch_1;
                                    goto LAB_001a3f66;
                                  }
                                }
                                printf("%s","Error: ");
                                printf("%c",0);
                                printf("%s"," or --");
                                _preparg_dispu("stop_char");
                                printf("%s"," must be followed by an integer.\n\n");
                                printf("%s");
                                ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                    ((Vec<const_char_*> *)local_290,0);
                                if (*ppcVar8 == (char *)0x0) {
                                  local_1138 = "";
                                }
                                else {
                                  ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                      ((Vec<const_char_*> *)local_290,0);
                                  local_1138 = *ppcVar8;
                                }
                                printf("%s",local_1138);
                                printf("%s"," --help\' for more information.\n");
                                argv_local._4_4_ = 0x10;
                                goto LAB_001a498e;
                              }
                              iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"args");
                              if (iVar3 == 0) {
                                iVar3 = _preparg_streq_u2m(pcStack_2d0 + 2,"help");
                                if (iVar3 == 0) goto LAB_001a34ff;
                                ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                    ((Vec<const_char_*> *)local_290,0);
                                usage(*ppcVar8,(char *)0x0,0);
                                argv_local._4_4_ = 0;
                                goto LAB_001a498e;
                              }
                              iVar3 = _preparg_arg_1._4_4_ + 1;
                              sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                                ((vector<const_char_*,_std::allocator<const_char_*>_>
                                                  *)local_290);
                              if (sVar7 <= (ulong)(long)iVar3) {
                                printf("%s","Error: ");
                                printf("%c",0x61);
                                printf("%s"," or --");
                                _preparg_dispu("args");
                                printf("%s"," must be followed by an argument.\n\n");
                                printf("%s");
                                ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                    ((Vec<const_char_*> *)local_290,0);
                                if (*ppcVar8 == (char *)0x0) {
                                  local_1160 = "";
                                }
                                else {
                                  ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                      ((Vec<const_char_*> *)local_290,0);
                                  local_1160 = *ppcVar8;
                                }
                                printf("%s",local_1160);
                                printf("%s"," --help\' for more information.\n");
                                argv_local._4_4_ = 0x11;
                                goto LAB_001a498e;
                              }
                              _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
                              ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                  ((Vec<const_char_*> *)local_290,
                                                   _preparg_arg_1._4_4_);
                              __preparg_num_arg = *ppcVar8;
                            }
                            else {
                              iVar3 = _preparg_arg_1._4_4_ + 1;
                              sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                                ((vector<const_char_*,_std::allocator<const_char_*>_>
                                                  *)local_290);
                              if (sVar7 <= (ulong)(long)iVar3) {
                                printf("%s","Error: ");
                                printf("%c",0x73);
                                printf("%s"," or --");
                                _preparg_dispu("style");
                                printf("%s"," must be followed by an argument.\n\n");
                                printf("%s");
                                ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                    ((Vec<const_char_*> *)local_290,0);
                                if (*ppcVar8 == (char *)0x0) {
                                  local_10f8 = "";
                                }
                                else {
                                  ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                      ((Vec<const_char_*> *)local_290,0);
                                  local_10f8 = *ppcVar8;
                                }
                                printf("%s",local_10f8);
                                printf("%s"," --help\' for more information.\n");
                                argv_local._4_4_ = 0xf;
                                goto LAB_001a498e;
                              }
                              _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
                              ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                  ((Vec<const_char_*> *)local_290,
                                                   _preparg_arg_1._4_4_);
                              pcStack_40 = *ppcVar8;
                            }
                          }
                          else {
                            iVar3 = _preparg_arg_1._4_4_ + 1;
                            sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                              ((vector<const_char_*,_std::allocator<const_char_*>_>
                                                *)local_290);
                            if (sVar7 <= (ulong)(long)iVar3) {
                              printf("%s","Error: ");
                              printf("%c",0x6f);
                              printf("%s"," or --");
                              _preparg_dispu("output");
                              printf("%s"," must be followed by an argument.\n\n");
                              printf("%s");
                              ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                  ((Vec<const_char_*> *)local_290,0);
                              if (*ppcVar8 == (char *)0x0) {
                                local_10c8 = "";
                              }
                              else {
                                ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                    ((Vec<const_char_*> *)local_290,0);
                                local_10c8 = *ppcVar8;
                              }
                              printf("%s",local_10c8);
                              printf("%s"," --help\' for more information.\n");
                              argv_local._4_4_ = 0xe;
                              goto LAB_001a498e;
                            }
                            _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
                            ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                                ((Vec<const_char_*> *)local_290,_preparg_arg_1._4_4_
                                                );
                            style = *ppcVar8;
                          }
                        }
                        else {
                          output._0_1_ = 1;
                        }
                      }
                      else {
                        output._1_1_ = 1;
                      }
                    }
                    else {
                      output._2_1_ = 1;
                    }
                  }
                  else {
                    output._3_1_ = 1;
                  }
                }
                else {
                  output._4_1_ = 1;
                }
              }
              else {
                output._5_1_ = 1;
              }
            }
            else {
              output._7_1_ = 1;
            }
          }
          else {
            iVar3 = _preparg_arg_1._4_4_ + 1;
            sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_290);
            if (sVar7 <= (ulong)(long)iVar3) {
              printf("%s","Error: ");
              printf("%c",0x69);
              printf("%s"," or --");
              _preparg_dispu("disp_inst_graph");
              printf("%s"," must be followed by an argument.\n\n");
              printf("%s");
              ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
              if (*ppcVar8 == (char *)0x0) {
                local_1078 = "";
              }
              else {
                ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
                local_1078 = *ppcVar8;
              }
              printf("%s",local_1078);
              printf("%s"," --help\' for more information.\n");
              argv_local._4_4_ = 5;
              goto LAB_001a498e;
            }
            _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
            ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                                ((Vec<const_char_*> *)local_290,_preparg_arg_1._4_4_);
            _never_ending = *ppcVar8;
          }
        }
        else {
          disp_inst_graph._6_1_ = 1;
        }
      }
      else {
        disp_inst_graph._7_1_ = 1;
      }
      goto LAB_001a3f66;
    }
    argv_local._4_4_ = 1;
  }
  else {
    pLVar5 = Hpipe::Lexer::root((Lexer *)&i);
    Hpipe::Lexem::display_dot(pLVar5,".res.dot",(char *)0x0);
    argv_local._4_4_ = 0;
  }
  goto LAB_001a49c2;
LAB_001a202e:
  if (!bVar2) {
    if (pcStack_60[1] == 'i') {
      if (pcStack_60[2] == '\0') {
        _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
        if ((int)argv_local <= (int)(uint)_preparg_arg) {
          printf("%s","Error: ");
          printf("%c",0x69);
          printf("%s"," or --");
          _preparg_dispu("disp_inst_graph");
          printf("%s"," must be followed by an argument.\n\n");
          printf("%s","Try \'");
          if (*ppcStack_18 == (char *)0x0) {
            local_ff8 = "";
          }
          else {
            local_ff8 = *ppcStack_18;
          }
          printf("%s",local_ff8);
          printf("%s"," --help\' for more information.\n");
          return 5;
        }
        _never_ending = ppcStack_18[(int)(uint)_preparg_arg];
      }
      else {
        _never_ending = pcStack_60 + 2;
      }
      goto LAB_001a2652;
    }
    if (pcStack_60[1] == 'o') {
      if (pcStack_60[2] == '\0') {
        _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
        if ((int)argv_local <= (int)(uint)_preparg_arg) {
          printf("%s","Error: ");
          printf("%c",0x6f);
          printf("%s"," or --");
          _preparg_dispu("output");
          printf("%s"," must be followed by an argument.\n\n");
          printf("%s","Try \'");
          if (*ppcStack_18 == (char *)0x0) {
            local_1000 = "";
          }
          else {
            local_1000 = *ppcStack_18;
          }
          printf("%s",local_1000);
          printf("%s"," --help\' for more information.\n");
          return 0xe;
        }
        style = ppcStack_18[(int)(uint)_preparg_arg];
      }
      else {
        style = pcStack_60 + 2;
      }
      goto LAB_001a2652;
    }
    if (pcStack_60[1] == 's') {
      if (pcStack_60[2] == '\0') {
        _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
        if ((int)argv_local <= (int)(uint)_preparg_arg) {
          printf("%s","Error: ");
          printf("%c",0x73);
          printf("%s"," or --");
          _preparg_dispu("style");
          printf("%s"," must be followed by an argument.\n\n");
          printf("%s","Try \'");
          if (*ppcStack_18 == (char *)0x0) {
            local_1008 = "";
          }
          else {
            local_1008 = *ppcStack_18;
          }
          printf("%s",local_1008);
          printf("%s"," --help\' for more information.\n");
          return 0xf;
        }
        pcStack_40 = ppcStack_18[(int)(uint)_preparg_arg];
      }
      else {
        pcStack_40 = pcStack_60 + 2;
      }
      goto LAB_001a2652;
    }
    if (pcStack_60[1] != '\0') {
      if (pcStack_60[1] != 'a') {
        if (pcStack_60[1] == 'h') {
          usage(*ppcStack_18,(char *)0x0,0);
          return 0;
        }
LAB_001a264a:
        _preparg_arg._4_4_ = (uint)_preparg_arg;
        goto LAB_001a2660;
      }
      if (pcStack_60[2] == '\0') {
        _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
        if ((int)argv_local <= (int)(uint)_preparg_arg) {
          printf("%s","Error: ");
          printf("%c",0x61);
          printf("%s"," or --");
          _preparg_dispu("args");
          printf("%s"," must be followed by an argument.\n\n");
          printf("%s","Try \'");
          if (*ppcStack_18 == (char *)0x0) {
            local_1018 = "";
          }
          else {
            local_1018 = *ppcStack_18;
          }
          printf("%s",local_1018);
          printf("%s"," --help\' for more information.\n");
          return 0x11;
        }
        __preparg_num_arg = ppcStack_18[(int)(uint)_preparg_arg];
      }
      else {
        __preparg_num_arg = pcStack_60 + 2;
      }
      goto LAB_001a2652;
    }
    if (pcStack_60[2] == '\0') {
      _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
      iVar3 = args._4_4_;
      if ((int)argv_local <= (int)(uint)_preparg_arg) goto LAB_001a241b;
      bVar2 = _preparg_atoi((int *)&error_list.display_escape_sequences,
                            ppcStack_18[(int)(uint)_preparg_arg]);
      iVar3 = args._4_4_;
    }
    else {
      bVar2 = _preparg_atoi((int *)&error_list.display_escape_sequences,pcStack_60 + 2);
      iVar3 = args._4_4_;
    }
    args._4_4_ = error_list._136_4_;
    if (!bVar2) {
LAB_001a241b:
      args._4_4_ = iVar3;
      printf("%s","Error: ");
      printf("%c",0);
      printf("%s"," or --");
      _preparg_dispu("stop_char");
      printf("%s"," must be followed by an integer.\n\n");
      printf("%s","Try \'");
      if (*ppcStack_18 == (char *)0x0) {
        local_1010 = "";
      }
      else {
        local_1010 = *ppcStack_18;
      }
      printf("%s",local_1010);
      printf("%s"," --help\' for more information.\n");
      return 0x10;
    }
  }
LAB_001a2652:
  _preparg_arg._0_4_ = (uint)_preparg_arg + 1;
  goto LAB_001a180c;
LAB_001a3604:
  if (!bVar2) {
    if (pcStack_2d0[1] == 'i') {
      if (pcStack_2d0[2] == '\0') {
        _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
        uVar6 = (ulong)(int)_preparg_arg_1._4_4_;
        sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_290);
        if (sVar7 <= uVar6) {
          printf("%s","Error: ");
          printf("%c",0x69);
          printf("%s"," or --");
          _preparg_dispu("disp_inst_graph");
          printf("%s"," must be followed by an argument.\n\n");
          printf("%s");
          ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
          if (*ppcVar8 == (char *)0x0) {
            local_1198 = "";
          }
          else {
            ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
            local_1198 = *ppcVar8;
          }
          printf("%s",local_1198);
          printf("%s"," --help\' for more information.\n");
          argv_local._4_4_ = 5;
          goto LAB_001a498e;
        }
        ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                            ((Vec<const_char_*> *)local_290,_preparg_arg_1._4_4_);
        _never_ending = *ppcVar8;
      }
      else {
        _never_ending = pcStack_2d0 + 2;
      }
      goto LAB_001a3f66;
    }
    if (pcStack_2d0[1] == 'o') {
      if (pcStack_2d0[2] == '\0') {
        _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
        uVar6 = (ulong)(int)_preparg_arg_1._4_4_;
        sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_290);
        if (sVar7 <= uVar6) {
          printf("%s","Error: ");
          printf("%c",0x6f);
          printf("%s"," or --");
          _preparg_dispu("output");
          printf("%s"," must be followed by an argument.\n\n");
          printf("%s");
          ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
          if (*ppcVar8 == (char *)0x0) {
            local_11c0 = "";
          }
          else {
            ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
            local_11c0 = *ppcVar8;
          }
          printf("%s",local_11c0);
          printf("%s"," --help\' for more information.\n");
          argv_local._4_4_ = 0xe;
          goto LAB_001a498e;
        }
        ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                            ((Vec<const_char_*> *)local_290,_preparg_arg_1._4_4_);
        style = *ppcVar8;
      }
      else {
        style = pcStack_2d0 + 2;
      }
      goto LAB_001a3f66;
    }
    if (pcStack_2d0[1] == 's') {
      if (pcStack_2d0[2] == '\0') {
        _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
        uVar6 = (ulong)(int)_preparg_arg_1._4_4_;
        sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_290);
        if (sVar7 <= uVar6) {
          printf("%s","Error: ");
          printf("%c",0x73);
          printf("%s"," or --");
          _preparg_dispu("style");
          printf("%s"," must be followed by an argument.\n\n");
          printf("%s");
          ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
          if (*ppcVar8 == (char *)0x0) {
            local_11e8 = "";
          }
          else {
            ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
            local_11e8 = *ppcVar8;
          }
          printf("%s",local_11e8);
          printf("%s"," --help\' for more information.\n");
          argv_local._4_4_ = 0xf;
          goto LAB_001a498e;
        }
        ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                            ((Vec<const_char_*> *)local_290,_preparg_arg_1._4_4_);
        pcStack_40 = *ppcVar8;
      }
      else {
        pcStack_40 = pcStack_2d0 + 2;
      }
      goto LAB_001a3f66;
    }
    if (pcStack_2d0[1] != '\0') {
      if (pcStack_2d0[1] != 'a') {
        if (pcStack_2d0[1] == 'h') {
          ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
          usage(*ppcVar8,(char *)0x0,0);
          argv_local._4_4_ = 0;
          goto LAB_001a498e;
        }
LAB_001a3f5b:
        _preparg_arg._4_4_ = _preparg_arg_1._4_4_;
        goto LAB_001a3f7a;
      }
      if (pcStack_2d0[2] == '\0') {
        _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
        uVar6 = (ulong)(int)_preparg_arg_1._4_4_;
        sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_290);
        if (sVar7 <= uVar6) {
          printf("%s","Error: ");
          printf("%c",0x61);
          printf("%s"," or --");
          _preparg_dispu("args");
          printf("%s"," must be followed by an argument.\n\n");
          printf("%s");
          ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
          if (*ppcVar8 == (char *)0x0) {
            local_1240 = "";
          }
          else {
            ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
            local_1240 = *ppcVar8;
          }
          printf("%s",local_1240);
          printf("%s"," --help\' for more information.\n");
          argv_local._4_4_ = 0x11;
          goto LAB_001a498e;
        }
        ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                            ((Vec<const_char_*> *)local_290,_preparg_arg_1._4_4_);
        __preparg_num_arg = *ppcVar8;
      }
      else {
        __preparg_num_arg = pcStack_2d0 + 2;
      }
      goto LAB_001a3f66;
    }
    if (pcStack_2d0[2] == '\0') {
      _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
      uVar6 = (ulong)(int)_preparg_arg_1._4_4_;
      sVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_290);
      iVar3 = args._4_4_;
      if (sVar7 <= uVar6) goto LAB_001a3c1e;
      ppcVar8 = Hpipe::Vec<const_char_*>::operator[]
                          ((Vec<const_char_*> *)local_290,_preparg_arg_1._4_4_);
      bVar2 = _preparg_atoi((int *)&cg.calls.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppcVar8);
      iVar3 = args._4_4_;
    }
    else {
      bVar2 = _preparg_atoi((int *)&cg.calls.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            pcStack_2d0 + 2);
      iVar3 = args._4_4_;
    }
    args._4_4_ = (int)cg.calls.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (!bVar2) {
LAB_001a3c1e:
      args._4_4_ = iVar3;
      printf("%s","Error: ");
      printf("%c",0);
      printf("%s"," or --");
      _preparg_dispu("stop_char");
      printf("%s"," must be followed by an integer.\n\n");
      printf("%s");
      ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
      if (*ppcVar8 == (char *)0x0) {
        local_1220 = "";
      }
      else {
        ppcVar8 = Hpipe::Vec<const_char_*>::operator[]((Vec<const_char_*> *)local_290,0);
        local_1220 = *ppcVar8;
      }
      printf("%s",local_1220);
      printf("%s"," --help\' for more information.\n");
      argv_local._4_4_ = 0x10;
      goto LAB_001a498e;
    }
  }
LAB_001a3f66:
  _preparg_arg_1._4_4_ = _preparg_arg_1._4_4_ + 1;
  goto LAB_001a2962;
LAB_001a3f7a:
  Hpipe::CharGraph::CharGraph((CharGraph *)local_468,(Lexer *)&i);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_488,"main",(allocator *)&ig.inst_pool.field_0xf);
  pLVar5 = Hpipe::Lexer::find_machine((Lexer *)&i,&local_488);
  Hpipe::CharGraph::read((CharGraph *)local_468,(int)pLVar5,__buf_01,sVar7);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator((allocator<char> *)&ig.inst_pool.field_0xf);
  if ((disp_inst_graph._6_1_ & 1) != 0) {
    Hpipe::CharGraph::display_dot((CharGraph *)local_468,".char.dot",(char *)0x0);
  }
  if ((local_468[0] & 1) == 0) {
    argv_local._4_4_ = 1;
  }
  else {
    Hpipe::InstructionGraph::InstructionGraph((InstructionGraph *)local_650);
    iVar3 = strcmp(pcStack_40,"C_STR");
    pcVar1 = _never_ending;
    if (iVar3 == 0) {
      local_1264 = args._4_4_;
    }
    else {
      local_1264 = -1;
    }
    local_650._0_4_ = local_1264;
    local_650[5] = output._3_1_ & 1;
    local_650[4] = output._1_1_ & 1;
    local_650[6] = (byte)output & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_7f0,pcVar1,
               (allocator *)
               ((long)&disp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::istringstream::istringstream(local_7d0,local_7f0,8);
    std::__cxx11::string::~string(local_7f0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&disp.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator(&local_840,(istream_type *)local_7d0);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator(&local_870);
    this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(ce.ctor.field_2._M_local_buf + 0xf);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_00);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_810,
               &local_840,&local_870,this_00);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(ce.ctor.field_2._M_local_buf + 0xf));
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::~istream_iterator(&local_870);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::~istream_iterator(&local_840);
    sVar10 = (size_t)(output._7_1_ & 1);
    Hpipe::InstructionGraph::read((InstructionGraph *)local_650,(int)local_468,local_810,sVar10);
    Hpipe::CppEmitter::CppEmitter((CppEmitter *)local_968);
    ce.stop_char._0_1_ = output._2_1_ & 1;
    iVar3 = strcmp(pcStack_40,"HPIPE_CB_STRING_PTR");
    if (iVar3 == 0) {
      local_968._4_4_ = 0;
      __buf_02 = extraout_RDX;
LAB_001a4424:
      Hpipe::CppEmitter::read((CppEmitter *)local_968,(int)local_650,__buf_02,sVar10);
      if ((output._4_1_ & 1) != 0) {
        Hpipe::Lexer::training_data((Vec<Hpipe::Lexer::TrainingData> *)&local_980,(Lexer *)&i);
        Hpipe::CppEmitter::bench((CppEmitter *)local_968,&local_980);
        Hpipe::Vec<Hpipe::Lexer::TrainingData>::~Vec((Vec<Hpipe::Lexer::TrainingData> *)&local_980);
      }
      if ((output._5_1_ & 1) == 0) {
        if ((output._4_1_ & 1) == 0) {
          std::__cxx11::string::string((string *)&local_a40);
          std::__cxx11::string::string((string *)&local_a60);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a80,"\n",&local_a81);
          std::__cxx11::string::string((string *)&local_aa8);
          Hpipe::StreamSepMaker::StreamSepMaker
                    ((StreamSepMaker *)local_a20,(TS *)&std::cout,&local_a40,&local_a60,&local_a80,
                     &local_aa8);
          std::__cxx11::string::~string((string *)&local_aa8);
          std::__cxx11::string::~string((string *)&local_a80);
          std::allocator<char>::~allocator((allocator<char> *)&local_a81);
          std::__cxx11::string::~string((string *)&local_a60);
          std::__cxx11::string::~string((string *)&local_a40);
          std::ofstream::ofstream(local_ca8);
          if (style != (char *)0x0) {
            std::ofstream::open(local_ca8,style,0x10);
            local_a20 = (undefined1  [8])local_ca8;
          }
          Hpipe::StreamSepMaker::operator<<
                    (&local_cf0,(StreamSepMaker *)local_a20,
                     (char (*) [104])
                     "// ----------------------------------------------------------------------------------------------------"
                    );
          Hpipe::StreamSep::~StreamSep(&local_cf0);
          Hpipe::StreamSepMaker::operator<<
                    (&local_d38,(StreamSepMaker *)local_a20,
                     (char (*) [27])"#ifdef HPIPE_PRELIMINARIES");
          Hpipe::StreamSep::~StreamSep(&local_d38);
          Hpipe::CppEmitter::write_preliminaries
                    ((CppEmitter *)local_968,(StreamSepMaker *)local_a20);
          Hpipe::StreamSepMaker::operator<<
                    (&local_d80,(StreamSepMaker *)local_a20,
                     (char (*) [30])"#endif // HPIPE_PRELIMINARIES");
          Hpipe::StreamSep::~StreamSep(&local_d80);
          Hpipe::StreamSepMaker::operator<<
                    (&local_dc8,(StreamSepMaker *)local_a20,(char (*) [1])0x247135);
          Hpipe::StreamSep::~StreamSep(&local_dc8);
          Hpipe::StreamSepMaker::operator<<
                    (&local_e10,(StreamSepMaker *)local_a20,
                     (char (*) [104])
                     "// ----------------------------------------------------------------------------------------------------"
                    );
          Hpipe::StreamSep::~StreamSep(&local_e10);
          Hpipe::StreamSepMaker::operator<<
                    (&local_e58,(StreamSepMaker *)local_a20,
                     (char (*) [26])"#ifdef HPIPE_DECLARATIONS");
          Hpipe::StreamSep::~StreamSep(&local_e58);
          Hpipe::CppEmitter::write_declarations((CppEmitter *)local_968,(StreamSepMaker *)local_a20)
          ;
          Hpipe::StreamSepMaker::operator<<
                    (&local_ea0,(StreamSepMaker *)local_a20,
                     (char (*) [29])"#endif // HPIPE_DECLARATIONS");
          Hpipe::StreamSep::~StreamSep(&local_ea0);
          Hpipe::StreamSepMaker::operator<<
                    (&local_ee8,(StreamSepMaker *)local_a20,(char (*) [1])0x247135);
          Hpipe::StreamSep::~StreamSep(&local_ee8);
          Hpipe::StreamSepMaker::operator<<
                    (&local_f30,(StreamSepMaker *)local_a20,
                     (char (*) [104])
                     "// ----------------------------------------------------------------------------------------------------"
                    );
          Hpipe::StreamSep::~StreamSep(&local_f30);
          Hpipe::StreamSepMaker::operator<<
                    (&local_f78,(StreamSepMaker *)local_a20,
                     (char (*) [25])"#ifdef HPIPE_DEFINITIONS");
          Hpipe::StreamSep::~StreamSep(&local_f78);
          Hpipe::CppEmitter::write_definitions((CppEmitter *)local_968,(StreamSepMaker *)local_a20);
          Hpipe::StreamSepMaker::operator<<
                    ((StreamSep *)&msg,(StreamSepMaker *)local_a20,
                     (char (*) [28])"#endif // HPIPE_DEFINITIONS");
          Hpipe::StreamSep::~StreamSep((StreamSep *)&msg);
          argv_local._4_4_ = 0;
          std::ofstream::~ofstream(local_ca8);
          Hpipe::StreamSepMaker::~StreamSepMaker((StreamSepMaker *)local_a20);
        }
        else {
          argv_local._4_4_ = 0;
        }
      }
      else {
        Hpipe::Lexer::test_data
                  ((Vec<Hpipe::Lexer::TestData> *)((long)&ss.end.field_2 + 8),(Lexer *)&i);
        argv_local._4_4_ =
             Hpipe::CppEmitter::test
                       ((CppEmitter *)local_968,
                        (vector<Hpipe::Lexer::TestData,_std::allocator<Hpipe::Lexer::TestData>_> *)
                        ((long)&ss.end.field_2 + 8));
        Hpipe::Vec<Hpipe::Lexer::TestData>::~Vec
                  ((Vec<Hpipe::Lexer::TestData> *)((long)&ss.end.field_2 + 8));
      }
    }
    else {
      iVar3 = strcmp(pcStack_40,"HPIPE_BUFFER");
      if (iVar3 == 0) {
        local_968._4_4_ = 1;
        __buf_02 = extraout_RDX_00;
        goto LAB_001a4424;
      }
      iVar3 = strcmp(pcStack_40,"BEG_END");
      if (iVar3 == 0) {
        local_968._4_4_ = 2;
        __buf_02 = extraout_RDX_01;
        goto LAB_001a4424;
      }
      iVar3 = strcmp(pcStack_40,"C_STR");
      if (iVar3 == 0) {
        local_968._4_4_ = 3;
        __buf_02 = extraout_RDX_02;
        goto LAB_001a4424;
      }
      poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown parse style ( ");
      poVar9 = std::operator<<(poVar9,pcStack_40);
      poVar9 = std::operator<<(poVar9," ). Possible values are HPIPE_BUFFER, BEG_END or C_STR");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    Hpipe::CppEmitter::~CppEmitter((CppEmitter *)local_968);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_810);
    std::__cxx11::istringstream::~istringstream(local_7d0);
    Hpipe::InstructionGraph::~InstructionGraph((InstructionGraph *)local_650);
  }
  Hpipe::CharGraph::~CharGraph((CharGraph *)local_468);
LAB_001a498e:
  Hpipe::Vec<const_char_*>::~Vec((Vec<const_char_*> *)local_290);
  Hpipe::Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Vec
            ((Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&lfc.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
LAB_001a49c2:
  Hpipe::Lexer::~Lexer((Lexer *)&i);
  Hpipe::Pool<Hpipe::Source,_32>::~Pool((Pool<Hpipe::Source,_32> *)&lexer.num_grp_bracket);
  Hpipe::ErrorList::~ErrorList((ErrorList *)local_100);
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char **argv ) {
    // args
    #include <PrepArg/declarations.h>
    #include <PrepArg/parse.h>
    if ( beg_files < 0 )
        return usage( argv[ 0 ], "Please specify one or several input file", 2 );

    try {
        // lexems
        ErrorList error_list;
        Pool<Source> source_pool;
        Lexer lexer( error_list, source_pool );
        if ( not disp_lexem_graph )
            lexer.read( source_pool.New( "src/Hpipe/predef.sipe", predef, false ) );
        for( int i = beg_files; i < argc; ++i )
            lexer.read( source_pool.New( argv[ i ] ) );
        if ( disp_lexem_graph ) {
            lexer.root()->display_dot();
            return 0;
        }
        if ( ! error_list )
            return 1;

        // update flags
        Vec<std::string> lfs = lexer.flags();
        Vec<const char *> lfc;
        lfc << "beg_flags section";
        for( std::string &str : lfs )
            lfc << str.c_str();
        #undef PREPARG_ARGV
        #undef PREPARG_ARGC
        #define PREPARG_ARGC lfc.size()
        #define PREPARG_ARGV lfc
        #include <PrepArg/parse.h>

        // char and transitions
        CharGraph cg( lexer );
        cg.read( lexer.find_machine( "main" ) );
        if ( disp_char_graph )
            cg.display_dot();
        if ( ! cg.ok )
            return 1;

        // instruction graph
        InstructionGraph ig;
        ig.stop_char    = strcmp( style, "C_STR" ) == 0 ? stop_char : -1;
        ig.boyer_moore  = boyer_moore;
        ig.no_training  = no_training;
        ig.never_ending = never_ending;

        std::istringstream iss( disp_inst_graph );
        std::vector<std::string> disp( std::istream_iterator<std::string>{ iss }, std::istream_iterator<std::string>{} );
        ig.read( &cg, disp, disp_inst_pred, disp_trans_freq );

        // emitter
        CppEmitter ce;
        ce.trace_labels = trace_labels;

        if      ( strcmp( style, "HPIPE_CB_STRING_PTR" ) == 0 ) { ce.buffer_type = CppEmitter::BT_HPIPE_CB_STRING_PTR; }
        else if ( strcmp( style, "HPIPE_BUFFER"        ) == 0 ) { ce.buffer_type = CppEmitter::BT_HPIPE_BUFFER       ; }
        else if ( strcmp( style, "BEG_END"             ) == 0 ) { ce.buffer_type = CppEmitter::BT_BEG_END            ; }
        else if ( strcmp( style, "C_STR"               ) == 0 ) { ce.buffer_type = CppEmitter::BT_C_STR              ; }
        else { std::cerr << "Unknown parse style ( " << style << " ). Possible values are HPIPE_BUFFER, BEG_END or C_STR" << std::endl; return 1; }

        ce.read( &ig );

        // output/test
        if ( benchmark )
            ce.bench( lexer.training_data() );

        if ( test )
            return ce.test( lexer.test_data() );

        if ( benchmark )
            return 0;

        StreamSepMaker ss( std::cout );
        std::ofstream fout;
        if ( output ) {
            fout.open( output );
            ss.stream = &fout;
        }

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_PRELIMINARIES";
        ce.write_preliminaries( ss );
        ss << "#endif // HPIPE_PRELIMINARIES";
        ss << "";

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_DECLARATIONS";
        ce.write_declarations( ss );
        ss << "#endif // HPIPE_DECLARATIONS";
        ss << "";

        ss << "// ----------------------------------------------------------------------------------------------------";
        ss << "#ifdef HPIPE_DEFINITIONS";
        ce.write_definitions( ss );
        ss << "#endif // HPIPE_DEFINITIONS";

        return 0;
    } catch ( const char *msg ) {
        std::cerr << msg << std::endl;
        return 1;
    }
}